

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O0

int secp256k1_ge_eq_var(secp256k1_ge *a,secp256k1_ge *b)

{
  int iVar1;
  long in_RSI;
  void *in_RDI;
  secp256k1_fe tmp;
  undefined1 local_40 [24];
  secp256k1_fe *in_stack_ffffffffffffffd8;
  secp256k1_fe *in_stack_ffffffffffffffe0;
  int local_4;
  
  secp256k1_ge_verify((secp256k1_ge *)0x10cbe8);
  secp256k1_ge_verify((secp256k1_ge *)0x10cbf2);
  if (*(int *)((long)in_RDI + 0x50) == *(int *)(in_RSI + 0x50)) {
    if (*(int *)((long)in_RDI + 0x50) == 0) {
      memcpy(local_40,in_RDI,0x28);
      secp256k1_fe_impl_normalize_weak((secp256k1_fe *)local_40);
      iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        memcpy(local_40,(void *)((long)in_RDI + 0x28),0x28);
        secp256k1_fe_impl_normalize_weak((secp256k1_fe *)local_40);
        iVar1 = secp256k1_fe_equal(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int secp256k1_ge_eq_var(const secp256k1_ge *a, const secp256k1_ge *b) {
    secp256k1_fe tmp;
    SECP256K1_GE_VERIFY(a);
    SECP256K1_GE_VERIFY(b);

    if (a->infinity != b->infinity) return 0;
    if (a->infinity) return 1;

    tmp = a->x;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->x)) return 0;

    tmp = a->y;
    secp256k1_fe_normalize_weak(&tmp);
    if (!secp256k1_fe_equal(&tmp, &b->y)) return 0;

    return 1;
}